

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

Expression __thiscall
cnn::expr::pick(expr *this,Expression *x,vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  pointer *pppNVar1;
  ComputationGraph *this_00;
  iterator __position;
  PickElement *this_01;
  undefined8 extraout_RDX;
  Expression EVar2;
  VariableIndex local_4c;
  PickElement *local_48;
  VariableIndex local_3c;
  initializer_list<cnn::VariableIndex> local_38;
  
  local_3c.t = (x->i).t;
  this_00 = x->pg;
  local_38._M_array = &local_3c;
  local_38._M_len = 1;
  local_4c.t = (uint)((ulong)((long)(this_00->nodes).
                                    super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
  this_01 = (PickElement *)operator_new(0x80);
  PickElement::PickElement(this_01,&local_38,v);
  __position._M_current =
       (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = this_01;
  if (__position._M_current ==
      (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)this_00,__position,
               (Node **)&local_48);
  }
  else {
    *__position._M_current = (Node *)this_01;
    pppNVar1 = &(this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  ComputationGraph::set_dim_for_new_node(this_00,&local_4c);
  *(ComputationGraph **)this = this_00;
  *(uint *)(this + 8) = local_4c.t;
  EVar2._8_8_ = extraout_RDX;
  EVar2.pg = (ComputationGraph *)this;
  return EVar2;
}

Assistant:

Expression pick(const Expression& x, const vector<unsigned> & v) { return Expression(x.pg, x.pg->add_function<PickElement>({x.i}, v)); }